

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void EnableOrDisableLogCategories(UniValue *cats,bool enable)

{
  long lVar1;
  bool bVar2;
  UniValue *pUVar3;
  string *__str;
  Logger *pLVar4;
  uint uVar5;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  string cat;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pUVar3 = UniValue::get_array(cats);
  UniValue::operator=(cats,pUVar3);
  uVar5 = 0;
  do {
    if ((ulong)(((long)(cats->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(cats->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                      .super__Vector_impl_data._M_start) / 0x58) <= (ulong)uVar5) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
LAB_002ec391:
      __stack_chk_fail();
    }
    pUVar3 = UniValue::operator[](cats,(ulong)uVar5);
    __str = UniValue::get_str_abi_cxx11_(pUVar3);
    std::__cxx11::string::string((string *)&cat,__str);
    if (enable) {
      pLVar4 = LogInstance();
      str._M_str = cat._M_dataplus._M_p;
      str._M_len = cat._M_string_length;
      bVar2 = BCLog::Logger::EnableCategory(pLVar4,str);
    }
    else {
      pLVar4 = LogInstance();
      str_00._M_str = cat._M_dataplus._M_p;
      str_00._M_len = cat._M_string_length;
      bVar2 = BCLog::Logger::DisableCategory(pLVar4,str_00);
    }
    if (bVar2 == false) {
      pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
      std::operator+(&bStack_78,"unknown logging category ",&cat);
      JSONRPCError(pUVar3,-8,&bStack_78);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_002ec391;
    }
    std::__cxx11::string::~string((string *)&cat);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static void EnableOrDisableLogCategories(UniValue cats, bool enable) {
    cats = cats.get_array();
    for (unsigned int i = 0; i < cats.size(); ++i) {
        std::string cat = cats[i].get_str();

        bool success;
        if (enable) {
            success = LogInstance().EnableCategory(cat);
        } else {
            success = LogInstance().DisableCategory(cat);
        }

        if (!success) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "unknown logging category " + cat);
        }
    }
}